

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask21_32(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  long unaff_RBX;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  
  uVar1 = in[1];
  vpmovsxbd_avx512f(_DAT_001ae070);
  vpmovsxbd_avx2(ZEXT816(0x5c5044382c201408));
  uVar2 = in[0x1b];
  *out = uVar1 << 0x15 | *in;
  uVar3 = in[0x1a];
  auVar9 = vpgatherdd_avx512f(*(undefined4 *)((long)in + unaff_RBX));
  auVar13 = vpmovsxbd_avx(ZEXT416(0x5030100));
  auVar8 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)uVar1));
  auVar8 = vpsllvd_avx2(auVar8,_DAT_001ae720);
  auVar6 = vpmovsxbd_avx(ZEXT416(0xd0b0907));
  auVar7 = vextracti32x4_avx512f(auVar9,3);
  auVar10 = vpermd_avx512f(ZEXT1664(auVar13),auVar9);
  auVar11 = vpermd_avx512f(ZEXT1664(auVar6),auVar9);
  auVar13 = vpinsrd_avx(auVar10._0_16_,uVar1,0);
  auVar14._0_16_ = ZEXT116(0) * auVar11._0_16_ + ZEXT116(1) * auVar13;
  auVar14._16_16_ = ZEXT116(1) * auVar11._0_16_;
  auVar14 = vpsrlvd_avx2(auVar14,_DAT_0019ec40);
  uVar1 = in[0x1c];
  uVar4 = in[0x1d];
  auVar8 = vpor_avx2(auVar8,auVar14);
  auVar10 = vpshufd_avx512f(auVar9,0xa0);
  auVar11 = vpmovzxdq_avx512f(auVar8);
  auVar10 = vpsrlvd_avx512f(auVar10,_DAT_001b1240);
  auVar12._4_4_ = auVar10._4_4_;
  auVar12._0_4_ = auVar11._0_4_;
  auVar12._8_4_ = auVar11._8_4_;
  auVar12._12_4_ = auVar10._12_4_;
  auVar12._16_4_ = auVar11._16_4_;
  auVar12._20_4_ = auVar10._20_4_;
  auVar12._24_4_ = auVar11._24_4_;
  auVar12._28_4_ = auVar10._28_4_;
  auVar12._32_4_ = auVar11._32_4_;
  auVar12._36_4_ = auVar10._36_4_;
  auVar12._40_4_ = auVar11._40_4_;
  auVar12._44_4_ = auVar10._44_4_;
  auVar12._48_4_ = auVar11._48_4_;
  auVar12._52_4_ = auVar10._52_4_;
  auVar12._60_4_ = auVar10._60_4_;
  auVar12._56_4_ = auVar11._56_4_;
  auVar9 = vpsllvd_avx512f(auVar9,_DAT_001b1280);
  uVar5 = *(ulong *)(in + 0x1e);
  auVar9 = vpord_avx512f(auVar9,auVar12);
  auVar9 = vmovdqu64_avx512f(auVar9);
  *(undefined1 (*) [64])(out + 1) = auVar9;
  out[0x11] = uVar2 << 0x17 | uVar3 << 2 | auVar7._12_4_ >> 0x13;
  out[0x12] = uVar1 << 0xc | uVar2 >> 9;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar5;
  auVar6 = vpsllvd_avx2(auVar13,_DAT_001ae060);
  auVar13 = vpinsrd_avx(ZEXT416(uVar4 * 2 | uVar1 >> 0x14),(uint)(uVar5 >> 10) & 0x3fffff,1);
  auVar13 = vpor_avx(auVar6,auVar13);
  *(long *)(out + 0x13) = auVar13._0_8_;
  return out + 0x15;
}

Assistant:

uint32_t *__fastpackwithoutmask21_32(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 21;
  ++out;
  *out = ((*in)) >> (21 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (21 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (21 - 9);
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (21 - 19);
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (21 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (21 - 18);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (21 - 7);
  ++in;
  *out |= ((*in)) << 7;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (21 - 17);
  ++in;
  *out |= ((*in)) << 17;
  ++out;
  *out = ((*in)) >> (21 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (21 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (21 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (21 - 15);
  ++in;
  *out |= ((*in)) << 15;
  ++out;
  *out = ((*in)) >> (21 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (21 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  *out = ((*in)) >> (21 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (21 - 13);
  ++in;
  *out |= ((*in)) << 13;
  ++out;
  *out = ((*in)) >> (21 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (21 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (21 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (21 - 11);
  ++in;
  *out |= ((*in)) << 11;
  ++out;
  ++in;

  return out;
}